

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkInterfaceLibraries * __thiscall
cmGeneratorTarget::GetLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,
          bool usage_requirements_only)

{
  bool bVar1;
  TargetType TVar2;
  pointer ppVar3;
  cmGeneratorTarget *local_c0;
  byte local_a9;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_a0;
  cmOptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_> local_78;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
  local_70 [3];
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_58;
  cmHeadToLinkInterfaceMap *hm;
  string CONFIG;
  cmGeneratorTarget *pcStack_28;
  bool usage_requirements_only_local;
  cmGeneratorTarget *head_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  CONFIG.field_2._M_local_buf[0xf] = usage_requirements_only;
  pcStack_28 = head;
  head_local = (cmGeneratorTarget *)config;
  config_local = (string *)this;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)
                 GetImportLinkInterface
                           (this,(string *)head_local,pcStack_28,
                            (bool)(CONFIG.field_2._M_local_buf[0xf] & 1));
  }
  else {
    TVar2 = GetType(this);
    if ((TVar2 != EXECUTABLE) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
      cmsys::SystemTools::UpperCase((string *)&hm,(string *)head_local);
      if ((CONFIG.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_a0 = &GetHeadToLinkInterfaceMap(this,(string *)head_local)->
                    super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
        ;
      }
      else {
        local_a0 = &GetHeadToLinkInterfaceUsageRequirementsMap(this,(string *)head_local)->
                    super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
        ;
      }
      local_58 = local_a0;
      bVar1 = std::
              map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
              ::empty(local_a0);
      local_a9 = 0;
      if (!bVar1) {
        local_70[0]._M_node =
             (_Base_ptr)
             std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
             ::begin(local_58);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->(local_70);
        local_a9 = (ppVar3->second).super_cmLinkInterface.field_0x6c ^ 0xff;
      }
      if ((local_a9 & 1) == 0) {
        local_c0 = (cmGeneratorTarget *)
                   std::
                   map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                   ::operator[](local_58,&stack0xffffffffffffffd8);
        if (((local_c0->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count & 0x100) ==
            0) {
          *(undefined1 *)
           ((long)&(local_c0->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1)
               = 1;
          ComputeLinkInterfaceLibraries
                    (this,(string *)head_local,(cmOptionalLinkInterface *)local_c0,pcStack_28,
                     (bool)(CONFIG.field_2._M_local_buf[0xf] & 1));
        }
        if (((local_c0->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count & 0x1000000
            ) == 0) {
          local_c0 = (cmGeneratorTarget *)0x0;
        }
        this_local = local_c0;
      }
      else {
        local_78._M_node =
             (_Base_ptr)
             std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
             ::begin(local_58);
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
                 ::operator->(&local_78);
        this_local = (cmGeneratorTarget *)&ppVar3->second;
      }
      std::__cxx11::string::~string((string *)&hm);
    }
    else {
      this_local = (cmGeneratorTarget *)0x0;
    }
  }
  return (cmLinkInterfaceLibraries *)this_local;
}

Assistant:

const cmLinkInterfaceLibraries *
cmGeneratorTarget::GetLinkInterfaceLibraries(const std::string& config,
                                    cmGeneratorTarget const* head,
                                    bool usage_requirements_only) const
{
  // Imported targets have their own link interface.
  if(this->IsImported())
    {
    return this->GetImportLinkInterface(config, head,
                                                usage_requirements_only);
    }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if(this->GetType() == cmState::EXECUTABLE &&
     !this->IsExecutableWithExports())
    {
    return 0;
    }

  // Lookup any existing link interface for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmHeadToLinkInterfaceMap& hm =
    (usage_requirements_only ?
     this->GetHeadToLinkInterfaceUsageRequirementsMap(config) :
     this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if(!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition)
    {
    return &hm.begin()->second;
    }

  cmOptionalLinkInterface& iface = hm[head];
  if(!iface.LibrariesDone)
    {
    iface.LibrariesDone = true;
    this->ComputeLinkInterfaceLibraries(
      config, iface, head, usage_requirements_only);
    }

  return iface.Exists? &iface : 0;
}